

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O2

ScenarioUpperBound * __thiscall
despot::RegDemo::CreateScenarioUpperBound(RegDemo *this,string *name,string particle_bound_name)

{
  bool bVar1;
  TrivialParticleUpperBound *this_00;
  ostream *poVar2;
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if (bVar1) {
    this_00 = (TrivialParticleUpperBound *)operator_new(0x10);
    despot::TrivialParticleUpperBound::TrivialParticleUpperBound(this_00,&this->super_DSPOMDP);
  }
  else {
    bVar1 = std::operator==(name,"MDP");
    if (!bVar1) {
      bVar1 = std::operator==(name,"DEFAULT");
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported scenario upper bound: ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::endl<char,std::char_traits<char>>(poVar2);
        exit(1);
      }
    }
    this_00 = (TrivialParticleUpperBound *)operator_new(0x38);
    despot::MDPUpperBound::MDPUpperBound
              ((MDPUpperBound *)this_00,&this->super_MDP,&this->super_StateIndexer);
  }
  return (ScenarioUpperBound *)this_00;
}

Assistant:

ScenarioUpperBound* RegDemo::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (name == "TRIVIAL") {
		return new TrivialParticleUpperBound(this);
	} else if (name == "MDP" || name == "DEFAULT") {
		return new MDPUpperBound(this, *this);
	} else {
		cerr << "Unsupported scenario upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}